

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

int yaml_parser_fetch_flow_collection_end(yaml_parser_t *parser,yaml_token_type_t type)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  yaml_token_t *__dest;
  int iVar6;
  int local_ac;
  int local_a8;
  int local_a4;
  yaml_token_type_t local_a0 [2];
  yaml_token_t token;
  yaml_mark_t end_mark;
  yaml_mark_t start_mark;
  yaml_token_type_t type_local;
  yaml_parser_t *parser_local;
  
  iVar6 = yaml_parser_remove_simple_key(parser);
  if (iVar6 == 0) {
    parser_local._4_4_ = 0;
  }
  else {
    iVar6 = yaml_parser_decrease_flow_level(parser);
    if (iVar6 == 0) {
      parser_local._4_4_ = 0;
    }
    else {
      parser->simple_key_allowed = 0;
      sVar1 = (parser->mark).index;
      sVar2 = (parser->mark).line;
      sVar3 = (parser->mark).column;
      (parser->mark).index = (parser->mark).index + 1;
      (parser->mark).column = (parser->mark).column + 1;
      parser->unread = parser->unread - 1;
      if ((*(parser->buffer).pointer & 0x80) == 0) {
        local_a4 = 1;
      }
      else {
        if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
          local_a8 = 2;
        }
        else {
          if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
            local_ac = 3;
          }
          else {
            local_ac = 0;
            if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
              local_ac = 4;
            }
          }
          local_a8 = local_ac;
        }
        local_a4 = local_a8;
      }
      (parser->buffer).pointer = (parser->buffer).pointer + local_a4;
      token.end_mark.column = (parser->mark).index;
      sVar4 = (parser->mark).line;
      sVar5 = (parser->mark).column;
      memset(local_a0,0,0x50);
      token.start_mark.column = token.end_mark.column;
      local_a0[0] = type;
      token.data._16_8_ = sVar1;
      token.start_mark.index = sVar2;
      token.start_mark.line = sVar3;
      token.end_mark.index = sVar4;
      token.end_mark.line = sVar5;
      if (((parser->tokens).tail == (parser->tokens).end) &&
         (iVar6 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,
                                    &(parser->tokens).tail,&(parser->tokens).end), iVar6 == 0)) {
        parser->error = YAML_MEMORY_ERROR;
        parser_local._4_4_ = 0;
      }
      else {
        __dest = (parser->tokens).tail;
        (parser->tokens).tail = __dest + 1;
        memcpy(__dest,local_a0,0x50);
        parser_local._4_4_ = 1;
      }
    }
  }
  return parser_local._4_4_;
}

Assistant:

static int
yaml_parser_fetch_flow_collection_end(yaml_parser_t *parser,
        yaml_token_type_t type)
{
    yaml_mark_t start_mark, end_mark;
    yaml_token_t token;

    /* Reset any potential simple key on the current flow level. */

    if (!yaml_parser_remove_simple_key(parser))
        return 0;

    /* Decrease the flow level. */

    if (!yaml_parser_decrease_flow_level(parser))
        return 0;

    /* No simple keys after the indicators ']' and '}'. */

    parser->simple_key_allowed = 0;

    /* Consume the token. */

    start_mark = parser->mark;
    SKIP(parser);
    end_mark = parser->mark;

    /* Create the FLOW-SEQUENCE-END of FLOW-MAPPING-END token. */

    TOKEN_INIT(token, type, start_mark, end_mark);

    /* Append the token to the queue. */

    if (!ENQUEUE(parser, parser->tokens, token))
        return 0;

    return 1;
}